

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
geometrycentral::
applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          geometrycentral *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *sourceData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *permNewToOld)

{
  pointer puVar1;
  long lVar2;
  pointer puVar3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  allocator_type local_19;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,
             (long)(sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_19);
  puVar1 = (sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(sourceData->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar2 = *(long *)this;
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      uVar4 = puVar1[lVar6];
      if (uVar4 != 0xffffffffffffffff) {
        puVar3[lVar6] = *(unsigned_long *)(lVar2 + uVar4 * 8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T, A1> applyPermutation(const std::vector<T, A1>& sourceData, const std::vector<size_t, A2>& permNewToOld) {
  std::vector<T, A1> retVal(permNewToOld.size());
  for (size_t i = 0; i < permNewToOld.size(); i++) {
    if (permNewToOld[i] != INVALID_IND) {
      retVal[i] = sourceData[permNewToOld[i]];
    }
  }
  return retVal;
}